

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * declareSequence(void)

{
  bool bVar1;
  treeNode *ptVar2;
  allocator local_39;
  string local_38;
  treeNode *local_18;
  treeNode *p;
  treeNode *ret;
  
  local_18 = declare();
  p = local_18;
  while( true ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,",",&local_39);
    bVar1 = match(&local_38,Empty);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (!bVar1) break;
    ptVar2 = declare();
    local_18->sibling = ptVar2;
    local_18 = local_18->sibling;
  }
  return p;
}

Assistant:

treeNode* declareSequence()
{
    auto ret = declare();
    auto p=ret;
    while(match(","))
    {
        p->sibling=declare();
        p=p->sibling;
    }
    return ret;
}